

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

lbool __thiscall Gluco::Solver::search(Solver *this,int nof_conflicts)

{
  ClauseAllocator *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  int64_t iVar8;
  int64_t iVar9;
  int64_t iVar10;
  bool bVar11;
  bool bVar12;
  CRef confl;
  Lit p;
  int *piVar13;
  ulong *puVar14;
  uint *puVar15;
  Clause *c;
  uint uVar16;
  ulong uVar17;
  int level;
  byte bVar18;
  uint8_t uVar19;
  int i;
  long lVar20;
  double dVar21;
  CRef cr;
  vec<Gluco::Lit> learnt_clause;
  uint szWoutSelectors;
  uint nblevels;
  int backtrack_level;
  vec<Gluco::Lit> selectors;
  
  if (this->ok == false) {
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                  ,0x410,"lbool Gluco::Solver::search(int)");
  }
  learnt_clause.data = (Lit *)0x0;
  learnt_clause.sz = 0;
  learnt_clause.cap = 0;
  selectors.data = (Lit *)0x0;
  selectors.sz = 0;
  selectors.cap = 0;
  this->starts = this->starts + 1;
  this_00 = &this->ca;
  bVar12 = false;
  do {
    while( true ) {
      confl = propagate(this);
      if (confl == 0xffffffff) break;
      lVar20 = this->conflicts + 1;
      this->conflicts = lVar20;
      this->conflictsRestarts = this->conflictsRestarts + 1;
      if ((lVar20 % 5000 == 0) && (this->var_decay < 0.95)) {
        this->var_decay = this->var_decay + 0.01;
      }
      if ((0 < this->verbosity) && (lVar20 % (long)this->verbEveryConflicts == 0)) {
        lVar4 = this->starts;
        piVar13 = &(this->trail).sz;
        if ((this->trail_lim).sz != 0) {
          piVar13 = (this->trail_lim).data;
        }
        iVar5 = this->nbstopsrestarts;
        iVar6 = this->dec_vars;
        iVar1 = *piVar13;
        uVar2 = (this->clauses).sz;
        iVar7 = this->clauses_literals;
        iVar8 = this->nbReduceDB;
        uVar3 = (this->learnts).sz;
        iVar9 = this->nbRemovedClauses;
        iVar10 = this->nbDL2;
        dVar21 = progressEstimate(this);
        printf("c | %8d   %7d    %5d | %7d %8d %8d | %5d %8d   %6d %8d | %6.3f %% |\n",
               dVar21 * 100.0,lVar4,(ulong)(uint)iVar5,lVar20 / lVar4,
               (ulong)(uint)((int)iVar6 - iVar1),(ulong)uVar2,(ulong)(uint)iVar7,(ulong)(uint)iVar8,
               (ulong)uVar3,(ulong)(uint)iVar10,(ulong)(uint)iVar9);
      }
      if ((this->trail_lim).sz == 0) {
LAB_004b6ebc:
        uVar19 = '\x01';
        goto LAB_004b6ebf;
      }
      bqueue<unsigned_int>::push(&this->trailQueue,(this->trail).sz);
      if (((10000 < this->conflictsRestarts) &&
          ((this->lbdQueue).queuesize == (this->lbdQueue).maxsize)) &&
         ((double)((this->trailQueue).sumofqueue / (ulong)(long)(this->trailQueue).queuesize &
                  0xffffffff) * this->R < (double)(this->trail).sz)) {
        (this->lbdQueue).queuesize = 0;
        (this->lbdQueue).first = 0;
        (this->lbdQueue).last = 0;
        (this->lbdQueue).sumofqueue = 0;
        this->nbstopsrestarts = this->nbstopsrestarts + 1;
        if (!bVar12) {
          this->lastblockatrestart = this->starts;
          this->nbstopsrestartssame = this->nbstopsrestartssame + 1;
        }
        bVar12 = true;
      }
      if (learnt_clause.data != (Lit *)0x0) {
        learnt_clause._8_8_ = learnt_clause._8_8_ & 0xffffffff00000000;
      }
      if (selectors.data != (Lit *)0x0) {
        selectors._8_8_ = selectors._8_8_ & 0xffffffff00000000;
      }
      analyze(this,confl,&learnt_clause,&selectors,&backtrack_level,&nblevels,&szWoutSelectors);
      uVar2 = nblevels;
      uVar17 = (ulong)nblevels;
      bqueue<unsigned_int>::push(&this->lbdQueue,nblevels);
      this->sumLBD = (float)uVar17 + this->sumLBD;
      cancelUntil(this,backtrack_level);
      if (this->certifiedUNSAT == true) {
        for (lVar20 = 0; lVar20 < learnt_clause.sz; lVar20 = lVar20 + 1) {
          uVar16 = learnt_clause.data[lVar20].x >> 1;
          uVar3 = ~uVar16;
          if ((learnt_clause.data[lVar20].x & 1U) == 0) {
            uVar3 = uVar16 + 1;
          }
          fprintf((FILE *)this->certifiedOutput,"%i ",(ulong)uVar3);
        }
        fwrite("0\n",2,1,(FILE *)this->certifiedOutput);
      }
      if (learnt_clause.sz == 1) {
        uncheckedEnqueue(this,(Lit)(learnt_clause.data)->x,0xffffffff);
        this->nbUn = this->nbUn + 1;
      }
      else {
        cr = ClauseAllocator::alloc<Gluco::vec<Gluco::Lit>>(this_00,&learnt_clause,true);
        puVar14 = (ulong *)RegionAllocator<unsigned_int>::operator[]
                                     (&this_00->super_RegionAllocator<unsigned_int>,cr);
        *puVar14 = *puVar14 & 0xffffffff8000001f | (ulong)((uVar2 & 0x3ffffff) << 5);
        puVar15 = RegionAllocator<unsigned_int>::operator[]
                            (&this_00->super_RegionAllocator<unsigned_int>,cr);
        puVar15[2] = szWoutSelectors;
        if (uVar2 < 3) {
          this->nbDL2 = this->nbDL2 + 1;
        }
        puVar15 = RegionAllocator<unsigned_int>::operator[]
                            (&this_00->super_RegionAllocator<unsigned_int>,cr);
        if (puVar15[1] == 2) {
          this->nbBin = this->nbBin + 1;
        }
        vec<unsigned_int>::push(&this->learnts,(uint *)&cr);
        attachClause(this,cr);
        c = (Clause *)
            RegionAllocator<unsigned_int>::operator[]
                      (&this_00->super_RegionAllocator<unsigned_int>,cr);
        claBumpActivity(this,c);
        uncheckedEnqueue(this,(Lit)(learnt_clause.data)->x,cr);
      }
      this->var_inc = (1.0 / this->var_decay) * this->var_inc;
      this->cla_inc = (1.0 / this->clause_decay) * this->cla_inc;
    }
    if ((((this->conflictsRestarts != 0) &&
         (iVar1 = (this->lbdQueue).queuesize, iVar1 == (this->lbdQueue).maxsize)) &&
        ((double)(this->sumLBD / (float)this->conflictsRestarts) <
         (double)((this->lbdQueue).sumofqueue / (ulong)(long)iVar1 & 0xffffffff) * this->K)) ||
       ((this->pstop != (int *)0x0 && (*this->pstop != 0)))) {
      (this->lbdQueue).queuesize = 0;
      (this->lbdQueue).first = 0;
      (this->lbdQueue).last = 0;
      (this->lbdQueue).sumofqueue = 0;
      dVar21 = progressEstimate(this);
      this->progress_estimate = dVar21;
      iVar1 = (this->trail_lim).sz;
      level = (this->assumptions).sz;
      if (iVar1 < level) {
        level = iVar1;
      }
      if (this->incremental == 0) {
        level = 0;
      }
      uVar19 = '\x02';
      cancelUntil(this,level);
      goto LAB_004b6ebf;
    }
    if ((this->trail_lim).sz == 0) {
      bVar11 = simplify(this);
      if (!bVar11) goto LAB_004b6ebc;
    }
    if (this->curRestart * (long)this->nbclausesbeforereduce <= this->conflicts) {
      if ((this->learnts).sz < 1) {
        __assert_fail("learnts.size()>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                      ,0x46a,"lbool Gluco::Solver::search(int)");
      }
      this->curRestart = this->conflicts / (long)this->nbclausesbeforereduce + 1;
      reduceDB(this);
      this->nbclausesbeforereduce = this->nbclausesbeforereduce + this->incReduceDB;
    }
    while (iVar1 = (this->trail_lim).sz, iVar1 < (this->assumptions).sz) {
      p.x = (this->assumptions).data[iVar1].x;
      bVar18 = (byte)p.x & 1;
      cr = CONCAT31(cr._1_3_,(this->assigns).data[p.x >> 1].value ^ bVar18);
      bVar11 = lbool::operator==((lbool *)&cr,(lbool)0x0);
      if (!bVar11) {
        cr = CONCAT31(cr._1_3_,bVar18 ^ (this->assigns).data[p.x >> 1].value);
        bVar11 = lbool::operator==((lbool *)&cr,(lbool)0x1);
        if (bVar11) {
          uVar19 = '\x01';
          analyzeFinal(this,(Lit)(p.x ^ 1),&this->conflict);
          goto LAB_004b6ebf;
        }
        if (p.x != 0xfffffffe) goto LAB_004b6a32;
        break;
      }
      newDecisionLevel(this);
    }
    this->decisions = this->decisions + 1;
    p = pickBranchLit(this);
    if (p.x == -2) {
      uVar19 = '\0';
LAB_004b6ebf:
      vec<Gluco::Lit>::~vec(&selectors);
      vec<Gluco::Lit>::~vec(&learnt_clause);
      return (lbool)uVar19;
    }
LAB_004b6a32:
    newDecisionLevel(this);
    uncheckedEnqueue(this,p,0xffffffff);
  } while( true );
}

Assistant:

lbool Solver::search(int nof_conflicts)
{
    assert(ok);
    int         backtrack_level;
    int         conflictC = 0;
    vec<Lit>    learnt_clause,selectors;
    unsigned int nblevels,szWoutSelectors;
    bool blocked=false;
    starts++;
    for (;;){
        CRef confl = propagate();
        if (confl != CRef_Undef){
            // CONFLICT
          conflicts++; conflictC++;conflictsRestarts++;
          if(conflicts%5000==0 && var_decay<0.95)
            var_decay += 0.01;

          if (verbosity >= 1 && conflicts%verbEveryConflicts==0){
            printf("c | %8d   %7d    %5d | %7d %8d %8d | %5d %8d   %6d %8d | %6.3f %% |\n", 
                   (int)starts,(int)nbstopsrestarts, (int)(conflicts/starts), 
                   (int)dec_vars - (trail_lim.size() == 0 ? trail.size() : trail_lim[0]), nClauses(), (int)clauses_literals, 
                   (int)nbReduceDB, nLearnts(), (int)nbDL2,(int)nbRemovedClauses, progressEstimate()*100);
          }
          if (decisionLevel() == 0) {
            return l_False;
            
          }

          trailQueue.push(trail.size());
          // BLOCK RESTART (CP 2012 paper)
          if( conflictsRestarts>LOWER_BOUND_FOR_BLOCKING_RESTART && lbdQueue.isvalid()  && trail.size()>R*trailQueue.getavg()) {
            lbdQueue.fastclear();
            nbstopsrestarts++;
            if(!blocked) {lastblockatrestart=starts;nbstopsrestartssame++;blocked=true;}
          }

            learnt_clause.clear();
            selectors.clear();
            analyze(confl, learnt_clause, selectors,backtrack_level,nblevels,szWoutSelectors);

            lbdQueue.push(nblevels);
            sumLBD += nblevels;
 
            cancelUntil(backtrack_level);

            if (certifiedUNSAT) {
              for (int i = 0; i < learnt_clause.size(); i++)
                fprintf(certifiedOutput, "%i " , (var(learnt_clause[i]) + 1) *
                            (-2 * sign(learnt_clause[i]) + 1) );
              fprintf(certifiedOutput, "0\n");
            }

            if (learnt_clause.size() == 1){
              uncheckedEnqueue(learnt_clause[0]);nbUn++;
            }else{
                CRef cr = ca.alloc(learnt_clause, true);
                ca[cr].setLBD(nblevels); 
                ca[cr].setSizeWithoutSelectors(szWoutSelectors);
                if(nblevels<=2) nbDL2++; // stats
                if(ca[cr].size()==2) nbBin++; // stats
                learnts.push(cr);
                attachClause(cr);

                claBumpActivity(ca[cr]);
                uncheckedEnqueue(learnt_clause[0], cr);
            }
            varDecayActivity();
            claDecayActivity();

           
        }else{

          // Our dynamic restart, see the SAT09 competition compagnion paper 
          if ( (conflictsRestarts && lbdQueue.isvalid() && lbdQueue.getavg()*K > sumLBD/conflictsRestarts) || (pstop && *pstop) ) {
            lbdQueue.fastclear();
            progress_estimate = progressEstimate();
            int bt = 0;
            if(incremental) { // DO NOT BACKTRACK UNTIL 0.. USELESS
              bt = (decisionLevel()<assumptions.size()) ? decisionLevel() : assumptions.size();
            }
            cancelUntil(bt);
            return l_Undef; 
          }

           // Simplify the set of problem clauses:
          if (decisionLevel() == 0 && !simplify()) {
            return l_False;
          }
            // Perform clause database reduction !
            if(conflicts>=curRestart* nbclausesbeforereduce) 
              {
                  
                assert(learnts.size()>0);
                curRestart = (conflicts/ nbclausesbeforereduce)+1;
                reduceDB();
                nbclausesbeforereduce += incReduceDB;
              }

            Lit next = lit_Undef;
            while (decisionLevel() < assumptions.size()){
                // Perform user provided assumption:
                Lit p = assumptions[decisionLevel()];
                if (value(p) == l_True){
                    // Dummy decision level:
                    newDecisionLevel();
                }else if (value(p) == l_False){
                    analyzeFinal(~p, conflict);
                    return l_False;
                }else{
                    next = p;
                    break;
                }
            }

            if (next == lit_Undef){
                // New variable decision:
                decisions++;
                next = pickBranchLit();

                if (next == lit_Undef){
                  //printf("c last restart ## conflicts  :  %d %d \n",conflictC,decisionLevel());
                  // Model found:
                  return l_True;
                }
            }

            // Increase decision level and enqueue 'next'
            newDecisionLevel();
            uncheckedEnqueue(next);
        }
    }
}